

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkreply.cpp
# Opt level: O3

qint64 __thiscall
QHttpNetworkReplyPrivate::readReplyBodyRaw
          (QHttpNetworkReplyPrivate *this,QIODevice *socket,QByteDataBuffer *out,qint64 size)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  qint64 local_70;
  QArrayData *local_68;
  char *pcStack_60;
  long local_58;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (**(code **)(*(long *)socket + 0xa0))(socket);
  if (size <= (long)uVar3) {
    uVar3 = size;
  }
  if (0x1ffff < (long)uVar3) {
    uVar3 = 0x20000;
  }
  uVar1 = this->readBufferMaxSize;
  uVar4 = uVar1;
  if ((long)(int)uVar3 < (long)uVar1) {
    uVar4 = (long)(int)uVar3;
  }
  if (uVar1 != 0) {
    uVar3 = uVar4;
  }
  uVar3 = uVar3 & 0xffffffff;
  lVar6 = 0;
  do {
    lVar2 = lVar6;
    if ((int)uVar3 < 1) break;
    local_68 = (QArrayData *)0x0;
    pcStack_60 = (char *)0x0;
    local_58 = 0;
    QByteArray::resize((longlong)&local_68);
    if ((local_68 == (QArrayData *)0x0) ||
       (1 < (local_68->ref_)._q_value.super___atomic_base<int>._M_i)) {
      QByteArray::reallocData((longlong)&local_68,(AllocationOption)local_58);
    }
    lVar5 = QIODevice::read((char *)socket,(longlong)pcStack_60);
    if (lVar5 < 1) {
      QByteArray::clear();
      local_70 = lVar6;
    }
    else {
      QByteArray::resize((longlong)&local_68);
      local_50.d.d = (Data *)local_68;
      local_50.d.ptr = pcStack_60;
      local_50.d.size = local_58;
      if (local_68 != (QArrayData *)0x0) {
        LOCK();
        (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_68->ref_)._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_58 != 0) {
        out->bufferCompleteSize = out->bufferCompleteSize + local_58;
        QtPrivate::QMovableArrayOps<QByteArray>::emplace<QByteArray>
                  ((QMovableArrayOps<QByteArray> *)out,(out->buffers).d.size,&local_50);
        QList<QByteArray>::end(&out->buffers);
      }
      if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
        }
      }
      size = size - lVar5;
      uVar3 = (**(code **)(*(long *)socket + 0xa0))(socket);
      if (size < (long)uVar3) {
        uVar3 = size;
      }
      if (0x1ffff < (long)uVar3) {
        uVar3 = 0x20000;
      }
      lVar6 = lVar6 + lVar5;
    }
    if (local_68 != (QArrayData *)0x0) {
      LOCK();
      (local_68->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_68->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_68->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_68,1,0x10);
      }
    }
    lVar2 = local_70;
  } while (0 < lVar5);
  local_70 = lVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_70;
}

Assistant:

qint64 QHttpNetworkReplyPrivate::readReplyBodyRaw(QIODevice *socket, QByteDataBuffer *out, qint64 size)
{
    // FIXME get rid of this function and just use readBodyFast and give it socket->bytesAvailable()
    qint64 bytes = 0;
    Q_ASSERT(socket);
    Q_ASSERT(out);

    int toBeRead = qMin<qint64>(128*1024, qMin<qint64>(size, socket->bytesAvailable()));

    if (readBufferMaxSize)
        toBeRead = qMin<qint64>(toBeRead, readBufferMaxSize);

    while (toBeRead > 0) {
        QByteArray byteData;
        byteData.resize(toBeRead);
        qint64 haveRead = socket->read(byteData.data(), byteData.size());
        if (haveRead <= 0) {
            // ### error checking here
            byteData.clear();
            return bytes;
        }

        byteData.resize(haveRead);
        out->append(byteData);
        bytes += haveRead;
        size -= haveRead;

        toBeRead = qMin<qint64>(128*1024, qMin<qint64>(size, socket->bytesAvailable()));
    }
    return bytes;

}